

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryLight(AssbinImporter *this,IOStream *stream,aiLight *l)

{
  uint uVar1;
  aiLightSourceType aVar2;
  DeadlyImportError *this_00;
  float fVar3;
  aiColor3D local_480;
  aiColor3D local_474;
  aiColor3D local_468;
  aiString local_45c;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  aiLight *local_20;
  aiLight *l_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = l;
  l_local = (aiLight *)stream;
  stream_local = (IOStream *)this;
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 != 0x1235) {
    local_55 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  Read<unsigned_int>((IOStream *)l_local);
  Read<aiString>(&local_45c,(IOStream *)l_local);
  aiString::operator=(&local_20->mName,&local_45c);
  aVar2 = Read<unsigned_int>((IOStream *)l_local);
  local_20->mType = aVar2;
  if (local_20->mType != aiLightSource_DIRECTIONAL) {
    fVar3 = Read<float>((IOStream *)l_local);
    local_20->mAttenuationConstant = fVar3;
    fVar3 = Read<float>((IOStream *)l_local);
    local_20->mAttenuationLinear = fVar3;
    fVar3 = Read<float>((IOStream *)l_local);
    local_20->mAttenuationQuadratic = fVar3;
  }
  Read<aiColor3D>((IOStream *)&local_468);
  aiColor3D::operator=(&local_20->mColorDiffuse,&local_468);
  Read<aiColor3D>((IOStream *)&local_474);
  aiColor3D::operator=(&local_20->mColorSpecular,&local_474);
  Read<aiColor3D>((IOStream *)&local_480);
  aiColor3D::operator=(&local_20->mColorAmbient,&local_480);
  if (local_20->mType == aiLightSource_SPOT) {
    fVar3 = Read<float>((IOStream *)l_local);
    local_20->mAngleInnerCone = fVar3;
    fVar3 = Read<float>((IOStream *)l_local);
    local_20->mAngleOuterCone = fVar3;
  }
  return;
}

Assistant:

void AssbinImporter::ReadBinaryLight( IOStream * stream, aiLight* l ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AILIGHT)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    l->mName = Read<aiString>(stream);
    l->mType = (aiLightSourceType)Read<unsigned int>(stream);

    if (l->mType != aiLightSource_DIRECTIONAL) {
        l->mAttenuationConstant = Read<float>(stream);
        l->mAttenuationLinear = Read<float>(stream);
        l->mAttenuationQuadratic = Read<float>(stream);
    }

    l->mColorDiffuse = Read<aiColor3D>(stream);
    l->mColorSpecular = Read<aiColor3D>(stream);
    l->mColorAmbient = Read<aiColor3D>(stream);

    if (l->mType == aiLightSource_SPOT) {
        l->mAngleInnerCone = Read<float>(stream);
        l->mAngleOuterCone = Read<float>(stream);
    }
}